

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilzo.c
# Opt level: O0

lzo_uint32 lzo_adler32(lzo_uint32 adler,uchar *buf,lzo_uint len)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  uint local_30;
  uint local_28;
  uint k;
  lzo_uint32 s2;
  lzo_uint32 s1;
  lzo_uint len_local;
  uchar *buf_local;
  lzo_uint32 adler_local;
  
  k = adler & 0xffff;
  local_28 = adler >> 0x10;
  _s2 = len;
  len_local = (lzo_uint)buf;
  if (buf == (uchar *)0x0) {
    buf_local._4_4_ = 1;
  }
  else {
    while (_s2 != 0) {
      if (_s2 < 0x15b0) {
        local_30 = (uint)_s2;
      }
      else {
        local_30 = 0x15b0;
      }
      _s2 = _s2 - local_30;
      for (; 0xf < local_30; local_30 = local_30 - 0x10) {
        iVar1 = *(byte *)len_local + k;
        iVar2 = (uint)*(byte *)(len_local + 1) + iVar1;
        iVar3 = (uint)*(byte *)(len_local + 2) + iVar2;
        iVar4 = (uint)*(byte *)(len_local + 3) + iVar3;
        iVar5 = (uint)*(byte *)(len_local + 4) + iVar4;
        iVar6 = (uint)*(byte *)(len_local + 5) + iVar5;
        iVar7 = (uint)*(byte *)(len_local + 6) + iVar6;
        iVar8 = (uint)*(byte *)(len_local + 7) + iVar7;
        iVar9 = (uint)*(byte *)(len_local + 8) + iVar8;
        iVar10 = (uint)*(byte *)(len_local + 9) + iVar9;
        iVar11 = (uint)*(byte *)(len_local + 10) + iVar10;
        iVar12 = (uint)*(byte *)(len_local + 0xb) + iVar11;
        iVar13 = (uint)*(byte *)(len_local + 0xc) + iVar12;
        iVar14 = (uint)*(byte *)(len_local + 0xd) + iVar13;
        iVar15 = (uint)*(byte *)(len_local + 0xe) + iVar14;
        k = (uint)*(byte *)(len_local + 0xf) + iVar15;
        local_28 = k + iVar15 + iVar14 + iVar13 + iVar12 + iVar11 + iVar10 + iVar9 + iVar8 + iVar7 +
                                                                                             iVar6 +
                                                                                             iVar5 +
                                                                                             iVar4 +
                                                                                             iVar3 +
                                                                                             iVar2 +
                                                                                             iVar1 +
                                                                                                                                                                                          
                                                  local_28;
        len_local = len_local + 0x10;
      }
      for (; local_30 != 0; local_30 = local_30 - 1) {
        k = *(byte *)len_local + k;
        local_28 = k + local_28;
        len_local = (lzo_uint)(len_local + 1);
      }
      k = k % 0xfff1;
      local_28 = local_28 % 0xfff1;
    }
    buf_local._4_4_ = local_28 << 0x10 | k;
  }
  return buf_local._4_4_;
}

Assistant:

LZO_PUBLIC(lzo_uint32)
lzo_adler32(lzo_uint32 adler, const lzo_bytep buf, lzo_uint len)
{
    lzo_uint32 s1 = adler & 0xffff;
    lzo_uint32 s2 = (adler >> 16) & 0xffff;
    unsigned k;

    if (buf == NULL)
        return 1;

    while (len > 0)
    {
        k = len < LZO_NMAX ? (unsigned) len : LZO_NMAX;
        len -= k;
        if (k >= 16) do
        {
            LZO_DO16(buf,0);
            buf += 16;
            k -= 16;
        } while (k >= 16);
        if (k != 0) do
        {
            s1 += *buf++;
            s2 += s1;
        } while (--k > 0);
        s1 %= LZO_BASE;
        s2 %= LZO_BASE;
    }
    return (s2 << 16) | s1;
}